

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O2

void helper_dshilo_mips64el(target_ulong shift,target_ulong ac,CPUMIPSState_conflict5 *env)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (env->active_tc).HI[ac];
  uVar3 = (env->active_tc).LO[ac];
  if ((shift & 0x7f) != 0) {
    bVar2 = (byte)(((int)shift << 0x19) >> 0x19);
    if ((char)bVar2 < '\0') {
      bVar1 = bVar2 + 0x40 & 0x3f;
      uVar4 = uVar3 >> bVar1 | uVar4 << 0x40 - bVar1;
      uVar3 = uVar3 << (-bVar2 & 0x3f);
    }
    else {
      uVar3 = uVar3 >> (bVar2 & 0x3f) | uVar4 << 0x40 - (bVar2 & 0x3f);
      uVar4 = uVar4 >> (bVar2 & 0x3f);
    }
  }
  (env->active_tc).HI[ac] = uVar4;
  (env->active_tc).LO[ac] = uVar3;
  return;
}

Assistant:

void helper_dshilo(target_ulong shift, target_ulong ac, CPUMIPSState *env)
{
    int8_t shift_t;
    uint64_t tempB, tempA;

    shift_t = (int8_t)(shift << 1) >> 1;

    tempB = env->active_tc.HI[ac];
    tempA = env->active_tc.LO[ac];

    if (shift_t != 0) {
        if (shift_t >= 0) {
            tempA = (tempB << (64 - shift_t)) | (tempA >> shift_t);
            tempB = tempB >> shift_t;
        } else {
            shift_t = -shift_t;
            tempB = (tempB << shift_t) | (tempA >> (64 - shift_t));
            tempA = tempA << shift_t;
        }
    }

    env->active_tc.HI[ac] = tempB;
    env->active_tc.LO[ac] = tempA;
}